

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAACluster.cpp
# Opt level: O0

void __thiscall GMAA_kGMAACluster::SaveClusterStats(GMAA_kGMAACluster *this,string *filename)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RSI;
  GMAA_kGMAACluster *in_stack_00000008;
  ofstream fp;
  string local_240 [48];
  long local_210 [66];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "GMAA_kGMAACluster::SaveClusterStats failed to open file ");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  SoftPrintClusteringStats_abi_cxx11_(in_stack_00000008);
  poVar3 = std::operator<<((ostream *)local_210,local_240);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_240);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void GMAA_kGMAACluster::SaveClusterStats(string filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
        cerr << "GMAA_kGMAACluster::SaveClusterStats failed to open file "
             << filename << endl;

    fp << SoftPrintClusteringStats() << endl;
}